

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O2

int IDASetEtaFixedStepBounds(void *ida_mem,sunrealtype eta_min_fx,sunrealtype eta_max_fx)

{
  bool bVar1;
  int iVar2;
  
  if (ida_mem == (void *)0x0) {
    iVar2 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x54,"IDASetEtaFixedStepBounds",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_io.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    bVar1 = 0.0 <= eta_min_fx;
    if (1.0 <= eta_min_fx) {
      eta_min_fx = 1.0;
    }
    *(ulong *)((long)ida_mem + 0x330) =
         ~-(ulong)bVar1 & 0x3ff0000000000000 | (ulong)eta_min_fx & -(ulong)bVar1;
    if (1.0 <= eta_max_fx) {
      *(sunrealtype *)((long)ida_mem + 0x328) = eta_max_fx;
    }
    else {
      *(undefined8 *)((long)ida_mem + 0x328) = 0x4000000000000000;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int IDASetEtaFixedStepBounds(void* ida_mem, sunrealtype eta_min_fx,
                             sunrealtype eta_max_fx)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* set allowed value or use default */
  if (eta_min_fx >= ZERO && eta_min_fx <= ONE)
  {
    IDA_mem->ida_eta_min_fx = eta_min_fx;
  }
  else { IDA_mem->ida_eta_min_fx = ETA_MIN_FX_DEFAULT; }

  if (eta_max_fx >= ONE) { IDA_mem->ida_eta_max_fx = eta_max_fx; }
  else { IDA_mem->ida_eta_max_fx = ETA_MAX_FX_DEFAULT; }

  return (IDA_SUCCESS);
}